

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
embree::ImageT<embree::Col3<float>_>::ImageT
          (ImageT<embree::Col3<float>_> *this,size_t width,size_t height,Col3<float> *color,
          string *name)

{
  undefined1 auVar1 [16];
  Col3<float> *pCVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  Image::Image(&this->super_Image,width,height,name);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002a02f8;
  uVar5 = height * width;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar4 = SUB168(auVar1 * ZEXT816(0xc),0);
  }
  pCVar2 = (Col3<float> *)operator_new__(uVar4);
  this->data = pCVar2;
  lVar3 = 8;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    pCVar2 = this->data;
    *(float *)((long)pCVar2 + lVar3 + -8) = color->r;
    *(float *)((long)pCVar2 + lVar3 + -4) = color->g;
    *(float *)((long)&pCVar2->r + lVar3) = color->b;
    lVar3 = lVar3 + 0xc;
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, const T& color, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      for (size_t i=0; i<width*height; i++) data[i] = color;
    }